

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O2

AffineSpace3fa *
embree::calculate_interpolated_space
          (AffineSpace3fa *__return_storage_ptr__,ISPCInstance *instance,float gtime)

{
  Vector *pVVar1;
  Vector *pVVar2;
  AffineSpace3fa *pAVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  uint uVar6;
  AffineSpace3fa *pAVar7;
  AffineSpace3fa *pAVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  uVar6 = instance->numTimeSteps;
  if (uVar6 == 1) {
    pAVar7 = instance->spaces;
    fVar10 = (pAVar7->l).vx.field_0.m128[0];
    fVar13 = (pAVar7->l).vx.field_0.m128[1];
    fVar14 = (pAVar7->l).vx.field_0.m128[2];
    fVar15 = (pAVar7->l).vx.field_0.m128[3];
    fVar16 = (pAVar7->l).vy.field_0.m128[0];
    fVar17 = (pAVar7->l).vy.field_0.m128[1];
    fVar18 = (pAVar7->l).vy.field_0.m128[2];
    fVar19 = (pAVar7->l).vy.field_0.m128[3];
    fVar20 = (pAVar7->l).vz.field_0.m128[0];
    fVar21 = (pAVar7->l).vz.field_0.m128[1];
    fVar22 = (pAVar7->l).vz.field_0.m128[2];
    fVar23 = (pAVar7->l).vz.field_0.m128[3];
    fVar24 = (pAVar7->p).field_0.m128[0];
    fVar25 = (pAVar7->p).field_0.m128[1];
    fVar26 = (pAVar7->p).field_0.m128[2];
    fVar12 = (pAVar7->p).field_0.m128[3];
  }
  else {
    fVar12 = (float)(int)(uVar6 - 1) * gtime;
    fVar10 = floorf(fVar12);
    uVar9 = uVar6 - 2;
    if ((int)fVar10 < (int)(uVar6 - 2)) {
      uVar9 = (int)fVar10;
    }
    uVar6 = 0;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    fVar12 = fVar12 - (float)(int)uVar6;
    fVar11 = 1.0 - fVar12;
    pAVar8 = instance->spaces;
    pAVar7 = pAVar8 + uVar6;
    pVVar5 = &pAVar8[uVar6].l.vy;
    pVVar1 = &pAVar8[uVar6].l.vz;
    pVVar2 = &pAVar8[uVar6].p;
    pAVar3 = pAVar8 + (ulong)uVar6 + 1;
    fVar10 = (pAVar3->l).vx.field_0.m128[0] * fVar12 + (pAVar7->l).vx.field_0.m128[0] * fVar11;
    fVar13 = (pAVar3->l).vx.field_0.m128[1] * fVar12 + (pAVar7->l).vx.field_0.m128[1] * fVar11;
    fVar14 = (pAVar3->l).vx.field_0.m128[2] * fVar12 + (pAVar7->l).vx.field_0.m128[2] * fVar11;
    fVar15 = (pAVar3->l).vx.field_0.m128[3] * fVar12 + (pAVar7->l).vx.field_0.m128[3] * fVar11;
    pVVar4 = &pAVar8[(ulong)uVar6 + 1].l.vy;
    fVar16 = (pVVar4->field_0).m128[0] * fVar12 + (pVVar5->field_0).m128[0] * fVar11;
    fVar17 = (pVVar4->field_0).m128[1] * fVar12 + (pVVar5->field_0).m128[1] * fVar11;
    fVar18 = (pVVar4->field_0).m128[2] * fVar12 + (pVVar5->field_0).m128[2] * fVar11;
    fVar19 = (pVVar4->field_0).m128[3] * fVar12 + (pVVar5->field_0).m128[3] * fVar11;
    pVVar5 = &pAVar8[(ulong)uVar6 + 1].l.vz;
    fVar20 = (pVVar5->field_0).m128[0] * fVar12 + (pVVar1->field_0).m128[0] * fVar11;
    fVar21 = (pVVar5->field_0).m128[1] * fVar12 + (pVVar1->field_0).m128[1] * fVar11;
    fVar22 = (pVVar5->field_0).m128[2] * fVar12 + (pVVar1->field_0).m128[2] * fVar11;
    fVar23 = (pVVar5->field_0).m128[3] * fVar12 + (pVVar1->field_0).m128[3] * fVar11;
    pVVar5 = &pAVar8[(ulong)uVar6 + 1].p;
    fVar24 = fVar12 * (pVVar5->field_0).m128[0] + fVar11 * (pVVar2->field_0).m128[0];
    fVar25 = fVar12 * (pVVar5->field_0).m128[1] + fVar11 * (pVVar2->field_0).m128[1];
    fVar26 = fVar12 * (pVVar5->field_0).m128[2] + fVar11 * (pVVar2->field_0).m128[2];
    fVar12 = fVar12 * (pVVar5->field_0).m128[3] + fVar11 * (pVVar2->field_0).m128[3];
  }
  (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar10;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar13;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar14;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar15;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar16;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar17;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar18;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar19;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar20;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar21;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar22;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar23;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar24;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar25;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar26;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar12;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa calculate_interpolated_space (ISPCInstance* instance, float gtime)
{
  if (instance->numTimeSteps == 1)
    return AffineSpace3fa(instance->spaces[0]);

   /* calculate time segment itime and fractional time ftime */
  const int time_segments = instance->numTimeSteps-1;
  const float time = gtime*(float)(time_segments);
  const int itime = clamp((int)(floor(time)),(int)0,time_segments-1);
  const float ftime = time - (float)(itime);
  return (1.0f-ftime)*AffineSpace3fa(instance->spaces[itime+0]) + ftime*AffineSpace3fa(instance->spaces[itime+1]);
}